

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall FSliderItem::MouseEvent(FSliderItem *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  float volume;
  FSoundID local_40;
  int local_3c;
  int local_38;
  int v;
  int slide_right;
  int slide_left;
  DListMenu *lm;
  int local_20;
  int y_local;
  int x_local;
  int type_local;
  FSliderItem *this_local;
  
  _slide_right = (DListMenu *)DMenu::CurrentMenu;
  lm._4_4_ = y;
  local_20 = x;
  y_local = type;
  _x_local = this;
  if ((type == 0) ||
     (bVar1 = DListMenu::CheckFocus((DListMenu *)DMenu::CurrentMenu,(FListMenuItem *)this), bVar1))
  {
    if (y_local == 2) {
      DListMenu::ReleaseFocus(_slide_right);
    }
    iVar2 = FFont::StringWidth(SmallFont,"Green");
    v = iVar2 + 8 + (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
    local_38 = v + 0x60;
    if ((y_local == 0) && ((local_20 < v || (local_38 <= local_20)))) {
      this_local._7_1_ = true;
    }
    else {
      local_20 = clamp<int>(local_20,v,local_38);
      iVar2 = this->mMinrange;
      iVar3 = ::Scale(local_20 - v,this->mMaxrange - this->mMinrange,local_38 - v);
      local_3c = iVar2 + iVar3;
      if (local_3c != this->mSelection) {
        this->mSelection = local_3c;
        FSoundID::FSoundID(&local_40,"menu/change");
        volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
        S_Sound(0x22,&local_40,volume,0.0);
      }
      if (y_local == 0) {
        DListMenu::SetFocus(_slide_right,(FListMenuItem *)this);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FSliderItem::MouseEvent(int type, int x, int y)
{
	DListMenu *lm = static_cast<DListMenu*>(DMenu::CurrentMenu);
	if (type != DMenu::MOUSE_Click)
	{
		if (!lm->CheckFocus(this)) return false;
	}
	if (type == DMenu::MOUSE_Release)
	{
		lm->ReleaseFocus();
	}

	int slide_left = SmallFont->StringWidth ("Green") + 8 + mXpos;
	int slide_right = slide_left + 12*8;	// 12 char cells with 8 pixels each.

	if (type == DMenu::MOUSE_Click)
	{
		if (x < slide_left || x >= slide_right) return true;
	}

	x = clamp(x, slide_left, slide_right);
	int v = mMinrange + Scale(x - slide_left, mMaxrange - mMinrange, slide_right - slide_left);
	if (v != mSelection)
	{
		mSelection = v;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
	}
	if (type == DMenu::MOUSE_Click)
	{
		lm->SetFocus(this);
	}
	return true;
}